

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bblif.c
# Opt level: O0

int Bbl_ManCheck(Bbl_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int local_20;
  int local_1c;
  int RetValue;
  int h;
  Bbl_Obj_t *pObj;
  Bbl_Man_t *p_local;
  
  local_20 = 1;
  local_1c = 0;
  while( true ) {
    bVar4 = false;
    if (local_1c < p->pObjs->nSize) {
      _RetValue = Bbl_VecObj(p->pObjs,local_1c);
      bVar4 = _RetValue != (Bbl_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Bbl_ObjIsNode(_RetValue);
    if ((iVar1 != 0) && (_RetValue->Fnc == -1)) {
      local_20 = 0;
      printf("Bbl_ManCheck(): Node %d does not have function specified.\n",
             (ulong)(uint)_RetValue->Id);
    }
    iVar1 = Bbl_ObjIsCi(_RetValue);
    if ((iVar1 != 0) && (_RetValue->Fnc != -1)) {
      local_20 = 0;
      printf("Bbl_ManCheck(): CI with %d has function specified.\n",(ulong)(uint)_RetValue->Id);
    }
    iVar1 = Bbl_ObjIsCo(_RetValue);
    if ((iVar1 != 0) && (_RetValue->Fnc != -1)) {
      local_20 = 0;
      printf("Bbl_ManCheck(): CO with %d has function specified.\n",(ulong)(uint)_RetValue->Id);
    }
    uVar2 = Vec_IntEntry(p->vFaninNums,_RetValue->Id);
    if (uVar2 != *(uint *)&_RetValue->field_0x8 >> 4) {
      local_20 = 0;
      uVar2 = _RetValue->Id;
      uVar3 = Vec_IntEntry(p->vFaninNums,_RetValue->Id);
      printf("Bbl_ManCheck(): Object %d has less fanins (%d) than declared (%d).\n",(ulong)uVar2,
             (ulong)uVar3,(ulong)(*(uint *)&_RetValue->field_0x8 >> 4));
    }
    iVar1 = Bbl_ObjSize(_RetValue);
    local_1c = iVar1 + local_1c;
  }
  return local_20;
}

Assistant:

int Bbl_ManCheck( Bbl_Man_t * p )
{
    Bbl_Obj_t * pObj;
    int h, RetValue = 1;
    Bbl_ManForEachObj_int( p->pObjs, pObj, h )
    {
        if ( Bbl_ObjIsNode(pObj) && pObj->Fnc == -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): Node %d does not have function specified.\n", pObj->Id );
        if ( Bbl_ObjIsCi(pObj) && pObj->Fnc != -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): CI with %d has function specified.\n", pObj->Id );
        if ( Bbl_ObjIsCo(pObj) && pObj->Fnc != -1 )
            RetValue = 0, printf( "Bbl_ManCheck(): CO with %d has function specified.\n", pObj->Id );
        if ( Vec_IntEntry(p->vFaninNums, pObj->Id) != (int)pObj->nFanins )
            RetValue = 0, printf( "Bbl_ManCheck(): Object %d has less fanins (%d) than declared (%d).\n", 
                pObj->Id, Vec_IntEntry(p->vFaninNums, pObj->Id), pObj->nFanins );
    }
    return RetValue;
}